

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O3

void llama_sampler_chain_free(llama_sampler *smpl)

{
  void *pvVar1;
  undefined8 *puVar2;
  long *plVar3;
  undefined8 *puVar4;
  
  pvVar1 = smpl->ctx;
  puVar4 = *(undefined8 **)((long)pvVar1 + 8);
  puVar2 = *(undefined8 **)((long)pvVar1 + 0x10);
  if (puVar4 != puVar2) {
    do {
      plVar3 = (long *)*puVar4;
      if (plVar3 != (long *)0x0) {
        if (*(code **)(*plVar3 + 0x28) != (code *)0x0) {
          (**(code **)(*plVar3 + 0x28))(plVar3);
        }
        operator_delete(plVar3,0x10);
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar2);
    if (pvVar1 == (void *)0x0) goto LAB_0020b283;
    puVar4 = *(undefined8 **)((long)pvVar1 + 8);
  }
  if (puVar4 != (undefined8 *)0x0) {
    operator_delete(puVar4,*(long *)((long)pvVar1 + 0x18) - (long)puVar4);
  }
LAB_0020b283:
  operator_delete(pvVar1,0x30);
  return;
}

Assistant:

static void llama_sampler_chain_free(struct llama_sampler * smpl) {
    auto * chain = (llama_sampler_chain *) smpl->ctx;

    for (auto * smpl : chain->samplers) {
        llama_sampler_free(smpl);
    }

    delete chain;
}